

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.cpp
# Opt level: O3

ostream * soplex::operator<<(ostream *os,SPxId *id)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  iVar1 = (id->super_DataKey).info;
  uVar2 = iVar1 >> 0x1f | 1;
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  if (uVar2 == 1) {
    pcVar5 = "col ";
  }
  else {
    if (uVar2 == 0) {
      pcVar5 = "Invalid ";
      lVar4 = 8;
      goto LAB_005f37b1;
    }
    pcVar5 = "row ";
  }
  lVar4 = 4;
LAB_005f37b1:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,(id->super_DataKey).idx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(id->super_DataKey).info);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SPxId& id)
{
   switch(id.type())
   {
   case SPxId::ROW_ID:
      os << "row ";
      break;

   case SPxId::COL_ID :
      os << "col ";
      break;

   case SPxId::INVALID :
      os << "Invalid ";
      break;

   default :
      throw SPxInternalCodeException("XSPXID01 This should never happen.");
   }

   os << id.idx << " (" << id.info << ")";

   return os;
}